

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O2

void gmlc::utilities::stringOps::trim(stringVector *input,string_view whitespace)

{
  pointer pbVar1;
  char *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  pointer this;
  string_view whitespace_00;
  
  whitespace_00._M_len = whitespace._M_str;
  pbVar1 = (input->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (this = (input->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start; this != pbVar1; this = this + 1) {
    whitespace_00._M_str = in_RCX;
    trimString((stringOps *)this,(string *)whitespace._M_len,whitespace_00);
  }
  return;
}

Assistant:

void trim(stringVector& input, std::string_view whitespace)
    {
        for (auto& str : input) {
            trimString(str, whitespace);
        }
    }